

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cpp
# Opt level: O2

bool vera::loadPLY(string *_filename,Mesh *_mesh)

{
  pointer pvVar1;
  vec<2,_float,_(glm::qualifier)0> vVar2;
  int iVar3;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar4;
  char cVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  istream *piVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  byte bVar15;
  int iVar16;
  undefined1 auVar17 [16];
  vec<4,_float,_(glm::qualifier)0> vVar18;
  int local_560;
  int local_55c;
  int local_558;
  int local_554;
  int local_540;
  int colorCompsFound;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  vertices;
  vec3 n;
  undefined4 uStack_50c;
  int local_4e4;
  float a;
  int normalsCoordsFound;
  vec3 v;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices;
  ulong local_4a0;
  ulong local_498;
  float b;
  float g;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  normals;
  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
  colors;
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  texcoord;
  string error;
  string line;
  string name;
  stringstream sline;
  string local_3b0 [368];
  fstream is;
  
  std::fstream::fstream(&is,(_filename->_M_dataplus)._M_p,_S_in);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 != '\0') {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    error._M_dataplus._M_p = (pointer)&error.field_2;
    error._M_string_length = 0;
    colorCompsFound = 0;
    normalsCoordsFound = 0;
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    error.field_2._M_local_buf[0] = '\0';
    name.field_2._M_local_buf[0] = '\0';
    colors.
    super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    colors.
    super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    colors.
    super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vertices.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vertices.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vertices.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    normals.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    normals.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    normals.
    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    texcoord.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    texcoord.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    texcoord.
    super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&line);
    bVar6 = std::operator!=(&line,"ply");
    if (bVar6) {
      std::__cxx11::string::assign((char *)&error);
      iVar13 = 1;
LAB_002a426a:
      poVar9 = std::operator<<((ostream *)&std::cout,"ERROR glMesh, load(): ");
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar13);
      poVar9 = std::operator<<(poVar9,":");
      poVar9 = std::operator<<(poVar9,(string *)&error);
      std::endl<char,std::char_traits<char>>(poVar9);
      poVar9 = std::operator<<((ostream *)&std::cout,"ERROR glMesh, load(): \"");
      poVar9 = std::operator<<(poVar9,(string *)&line);
      poVar9 = std::operator<<(poVar9,"\"");
      bVar6 = true;
      std::endl<char,std::char_traits<char>>(poVar9);
    }
    else {
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&is,(string *)&line)
      ;
      bVar6 = std::operator!=(&line,"format ascii 1.0");
      if (bVar6) {
        std::__cxx11::string::assign((char *)&error);
        iVar13 = 2;
        goto LAB_002a426a;
      }
      iVar14 = -1;
      iVar12 = 0;
      iVar13 = 3;
      iVar3 = 0;
      local_558 = 0;
      local_560 = 0;
      local_55c = 0;
      local_554 = 0;
      iVar16 = -1;
      local_4e4 = 0;
      local_540 = 0;
      local_498 = 0;
      local_4a0 = 0;
      bVar6 = false;
      bVar15 = 0;
      while( true ) {
        piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)&is,(string *)&line);
        if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
        lVar11 = std::__cxx11::string::find((char *)&line,0x30100b);
        if (lVar11 == 0) goto LAB_002a49d7;
        if (((bVar15 & 0xfd) == 0) &&
           (lVar11 = std::__cxx11::string::find((char *)&line,0x301013), lVar11 == 0)) {
          iVar14 = 0;
          if (0 < iVar16) {
            iVar14 = iVar16;
          }
          std::__cxx11::string::substr((ulong)&sline,(ulong)&line);
          iVar8 = toInt((string *)&sline);
          std::
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ::resize(&vertices,(long)iVar8);
          iVar14 = iVar14 + 1;
          std::__cxx11::string::~string((string *)&sline);
          goto LAB_002a49d3;
        }
        if (bVar15 < 2) {
          lVar11 = std::__cxx11::string::find((char *)&line,0x301022);
          if (lVar11 == 0) {
            iVar16 = 0;
            if (0 < iVar14) {
              iVar16 = iVar14;
            }
            std::__cxx11::string::substr((ulong)&sline,(ulong)&line);
            iVar8 = toInt((string *)&sline);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                      (&indices,(long)(iVar8 * 3));
            iVar16 = iVar16 + 1;
            std::__cxx11::string::~string((string *)&sline);
            bVar15 = 2;
            goto LAB_002a49d7;
          }
          if (bVar15 != 1) goto LAB_002a46ef;
          lVar11 = std::__cxx11::string::find((char *)&line,0x30102f);
          if (((lVar11 == 0) ||
              (lVar11 = std::__cxx11::string::find((char *)&line,0x301040), lVar11 == 0)) ||
             (lVar11 = std::__cxx11::string::find((char *)&line,0x301051), lVar11 == 0)) {
            local_4e4 = local_4e4 + 1;
LAB_002a49d3:
            bVar15 = 1;
          }
          else {
            lVar11 = std::__cxx11::string::find((char *)&line,0x301062);
            if (((lVar11 == 0) ||
                (lVar11 = std::__cxx11::string::find((char *)&line,0x301074), lVar11 == 0)) ||
               (lVar11 = std::__cxx11::string::find((char *)&line,0x301086), lVar11 == 0)) {
              local_554 = iVar12 + 1;
              normalsCoordsFound = local_554;
              iVar12 = local_554;
              if (local_554 != 3) goto LAB_002a49d3;
              std::
              vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ::resize(&normals,((long)vertices.
                                       super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)vertices.
                                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0xc);
              local_554 = 3;
              iVar12 = 3;
              bVar15 = 1;
            }
            else {
              lVar11 = std::__cxx11::string::find((char *)&line,0x301098);
              if (((lVar11 != 0) &&
                  (lVar11 = std::__cxx11::string::find((char *)&line,0x3010a9), lVar11 != 0)) &&
                 ((lVar11 = std::__cxx11::string::find((char *)&line,0x3010ba), lVar11 != 0 &&
                  (lVar11 = std::__cxx11::string::find((char *)&line,0x3010cb), lVar11 != 0)))) {
                lVar11 = std::__cxx11::string::find((char *)&line,0x3010dc);
                if ((((lVar11 == 0) ||
                     (lVar11 = std::__cxx11::string::find((char *)&line,0x3010ef), lVar11 == 0)) ||
                    (lVar11 = std::__cxx11::string::find((char *)&line,0x301104), lVar11 == 0)) ||
                   (lVar11 = std::__cxx11::string::find((char *)&line,0x301118), lVar11 == 0)) {
                  local_560 = iVar3 + 1;
                  colorCompsFound = local_560;
                  std::
                  vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                  ::resize(&colors,((long)vertices.
                                          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)vertices.
                                         super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0xc);
                  bVar6 = false;
                  local_55c = local_560;
                  local_558 = local_560;
                  iVar3 = local_560;
                }
                else {
                  lVar11 = std::__cxx11::string::find((char *)&line,0x30112d);
                  if ((lVar11 == 0) ||
                     (lVar11 = std::__cxx11::string::find((char *)&line,0x30113e), lVar11 == 0)) {
                    std::
                    vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                    ::resize(&texcoord,
                             ((long)vertices.
                                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)vertices.
                                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0xc);
                  }
                  else {
                    lVar11 = std::__cxx11::string::find((char *)&line,0x30114f);
                    if ((lVar11 != 0) &&
                       (lVar11 = std::__cxx11::string::find((char *)&line,0x301168), lVar11 != 0))
                    goto LAB_002a46ef;
                    std::
                    vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                    ::resize(&texcoord,
                             ((long)vertices.
                                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)vertices.
                                   super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0xc);
                  }
                  local_540 = local_540 + 1;
                }
                goto LAB_002a49d3;
              }
              local_560 = iVar3 + 1;
              bVar6 = true;
              colorCompsFound = local_560;
              std::
              vector<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
              ::resize(&colors,((long)vertices.
                                      super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)vertices.
                                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0xc);
              bVar15 = 1;
              local_55c = local_560;
              local_558 = local_560;
              iVar3 = local_560;
            }
          }
        }
        else {
          if (((bVar15 == 2) &&
              (lVar11 = std::__cxx11::string::find((char *)&line,0x301181), lVar11 != 0)) &&
             (bVar7 = std::operator!=(&line,"end_header"), bVar7)) {
            std::__cxx11::string::assign((char *)&error);
            goto LAB_002a426a;
          }
LAB_002a46ef:
          bVar7 = std::operator==(&line,"end_header");
          if (bVar7) {
            if (iVar3 - 5U < 0xfffffffe &&
                colors.
                super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                colors.
                super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              toString<int>((string *)&v,&colorCompsFound);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n
                             ,
                             "data has color coordiantes but not correct number of components. Found "
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &v);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &sline,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&n," expecting 3 or 4");
            }
            else {
              if (iVar12 == 3 ||
                  normals.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  normals.
                  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                if (vertices.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish ==
                    vertices.
                    super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
                  poVar9 = std::operator<<((ostream *)&std::cout,
                                           "ERROR glMesh, load(): mesh loaded from \"");
                  poVar9 = std::operator<<(poVar9,(string *)_filename);
                  poVar9 = std::operator<<(poVar9,"\" has no vertices");
                  std::endl<char,std::char_traits<char>>(poVar9);
                }
                if (iVar14 == -1) {
                  iVar14 = 9999;
                }
                if (iVar16 == -1) {
                  iVar16 = 9999;
                }
                bVar15 = (iVar16 <= iVar14) * '\x02' + 3;
                local_560 = iVar3;
                local_55c = iVar3;
                local_558 = iVar3;
                local_554 = iVar12;
                goto LAB_002a49d7;
              }
              toString<int>((string *)&v,&normalsCoordsFound);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n
                             ,
                             "data has normal coordiantes but not correct number of components. Found "
                             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &v);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &sline,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&n," expecting 3");
            }
            std::__cxx11::string::operator=((string *)&error,(string *)&sline);
            std::__cxx11::string::~string((string *)&sline);
            std::__cxx11::string::~string((string *)&n);
            std::__cxx11::string::~string((string *)&v);
            goto LAB_002a426a;
          }
          if (bVar15 == 5) {
            if (indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              bVar15 = 5;
            }
            else {
              std::__cxx11::stringstream::stringstream((stringstream *)&sline);
              std::__cxx11::stringbuf::str(local_3b0);
              std::istream::operator>>((string *)&sline,(int *)&n);
              aVar4 = n.field_0;
              if (n.field_0 == (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3)
              {
                std::istream::operator>>(&sline,(int *)&v);
                lVar11 = (long)((int)local_4a0 * 3);
                *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                 (indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar11) = v.field_0;
                std::istream::operator>>(&sline,(int *)&v);
                *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                 (indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar11 + 1) = v.field_0;
                std::istream::operator>>(&sline,(int *)&v);
                *(anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 *)
                 (indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar11 + 2) = v.field_0;
                local_4a0 = (ulong)((int)local_4a0 + 1);
                bVar15 = (iVar16 <= iVar14 ||
                         (ulong)((long)indices.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)indices.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2) / 3 !=
                         local_4a0) * '\x02' + 3;
              }
              else {
                std::__cxx11::string::assign((char *)&error);
                bVar15 = 5;
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)&sline);
              if (aVar4 != (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3)
              goto LAB_002a426a;
            }
          }
          else if (bVar15 == 3) {
            std::__cxx11::stringstream::stringstream((stringstream *)&sline);
            std::__cxx11::stringbuf::str(local_3b0);
            std::istream::_M_extract<float>((float *)&sline);
            std::istream::_M_extract<float>((float *)&sline);
            if (2 < local_4e4) {
              std::istream::_M_extract<float>((float *)&sline);
            }
            lVar11 = (long)(int)local_498;
            vertices.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar11].field_2 = v.field_2;
            vertices.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar11].field_0 = v.field_0;
            vertices.
            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar11].field_1 = v.field_1;
            if (0 < local_554) {
              std::istream::_M_extract<float>((float *)&sline);
              std::istream::_M_extract<float>((float *)&sline);
              std::istream::_M_extract<float>((float *)&sline);
              normals.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar11].field_2 = n.field_2;
              normals.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar11].field_0 = n.field_0;
              normals.
              super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar11].field_1 = n.field_1;
            }
            if (0 < local_55c) {
              if (bVar6) {
                std::istream::_M_extract<float>((float *)&sline);
                std::istream::_M_extract<float>((float *)&sline);
                std::istream::_M_extract<float>((float *)&sline);
                if (3 < local_558) {
                  std::istream::_M_extract<float>((float *)&sline);
                }
                pvVar1 = colors.
                         super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar11;
                pvVar1->field_0 =
                     (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)n.field_0;
                pvVar1->field_1 =
                     (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)n.field_1;
                pvVar1->field_2 =
                     (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)n.field_2;
                pvVar1->field_3 =
                     (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)uStack_50c;
                local_560 = local_558;
                local_55c = local_560;
              }
              else {
                std::istream::_M_extract<float>((float *)&sline);
                std::istream::_M_extract<float>((float *)&sline);
                std::istream::_M_extract<float>((float *)&sline);
                if (3 < local_560) {
                  std::istream::_M_extract<float>((float *)&sline);
                }
                auVar17._4_4_ = g;
                auVar17._0_4_ = n.field_0;
                auVar17._12_4_ = 0x437f0000;
                auVar17._8_4_ = b;
                vVar18 = (vec<4,_float,_(glm::qualifier)0>)divps(auVar17,_DAT_002d7050);
                colors.
                super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar11] = vVar18;
                local_55c = local_560;
              }
            }
            if (0 < local_540) {
              std::istream::_M_extract<float>((float *)&sline);
              std::istream::_M_extract<float>((float *)&sline);
              vVar2.field_1.y = n.field_1.y;
              vVar2.field_0.x = n.field_0.x;
              texcoord.
              super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar11] = vVar2;
            }
            local_498 = (ulong)((int)local_498 + 1);
            bVar15 = (iVar14 < iVar16 &&
                     ((long)vertices.
                            super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)vertices.
                           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0xc == local_498) * '\x02' +
                     3;
            std::__cxx11::stringstream::~stringstream((stringstream *)&sline);
          }
        }
LAB_002a49d7:
        iVar13 = iVar13 + 1;
      }
      std::fstream::close();
      Mesh::addColors(_mesh,&colors);
      Mesh::addVertices(_mesh,&vertices);
      Mesh::addTexCoords(_mesh,&texcoord);
      if (indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        _mesh->m_drawMode = POINTS;
      }
      else {
        Mesh::addIndices(_mesh,&indices);
      }
      if (normals.
          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          normals.
          super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        Mesh::computeNormals(_mesh);
      }
      else {
        Mesh::addNormals(_mesh,&normals);
      }
      Mesh::computeTangents(_mesh);
      bVar6 = false;
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    std::
    _Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
    ::~_Vector_base(&texcoord.
                     super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
                   );
    std::
    _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::~_Vector_base(&normals.
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   );
    std::
    _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
    ::~_Vector_base(&vertices.
                     super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   );
    std::
    _Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
    ::~_Vector_base(&colors.
                     super__Vector_base<glm::vec<4,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<4,_float,_(glm::qualifier)0>_>_>
                   );
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&error);
    std::__cxx11::string::~string((string *)&line);
    bVar7 = true;
    if (!bVar6) goto LAB_002a4390;
  }
  std::fstream::close();
  poVar9 = std::operator<<((ostream *)&std::cout,"ERROR glMesh, can not load  ");
  poVar9 = std::operator<<(poVar9,(string *)_filename);
  std::endl<char,std::char_traits<char>>(poVar9);
  bVar7 = false;
LAB_002a4390:
  std::fstream::~fstream(&is);
  return bVar7;
}

Assistant:

bool loadPLY( const std::string& _filename, Mesh& _mesh ) {
    std::fstream is(_filename.c_str(), std::ios::in);
    if (is.is_open()) {
        std::string line;
        std::string error;

        int orderVertices=-1;
        int orderIndices=-1;

        int vertexCoordsFound=0;
        int colorCompsFound=0;
        int texCoordsFound=0;
        int normalsCoordsFound=0;

        int currentVertex = 0;
        int currentFace = 0;

        bool floatColor = false;

        enum State{
            Header,
            VertexDef,
            FaceDef,
            Vertices,
            Normals,
            Faces
        };

        State state = Header;

        int lineNum = 0;

        std::string name;

        std::vector<glm::vec4> colors;
        std::vector<glm::vec3> vertices;
        std::vector<glm::vec3> normals;
        std::vector<glm::vec2> texcoord;
        std::vector<INDEX_TYPE> indices;

        std::getline(is,line);
        lineNum++;
        if (line!="ply") {
            error = "wrong format, expecting 'ply'";
            goto clean;
        }

        std::getline(is,line);
        lineNum++;
        if (line!="format ascii 1.0") {
            error = "wrong format, expecting 'format ascii 1.0'";
            goto clean;
        }

        while(std::getline(is,line)) {
            lineNum++;
            if (line.find("comment")==0) {
                continue;
            }

            if ((state==Header || state==FaceDef) && line.find("element vertex")==0) {
                state = VertexDef;
                orderVertices = glm::max(orderIndices, 0)+1;
                vertices.resize(toInt(line.substr(15)));
                continue;
            }

            if ((state==Header || state==VertexDef) && line.find("element face")==0) {
                state = FaceDef;
                orderIndices = glm::max(orderVertices, 0)+1;
                indices.resize(toInt(line.substr(13))*3);
                continue;
            }

            if (state==VertexDef && (line.find("property float x")==0 || line.find("property float y")==0 || line.find("property float z")==0)) {
                vertexCoordsFound++;
                continue;
            }

            if (state==VertexDef && (line.find("property float nx")==0 || line.find("property float ny")==0 || line.find("property float nz")==0)) {
                normalsCoordsFound++;
                if (normalsCoordsFound==3) normals.resize(vertices.size());
                continue;
            }

            if (state==VertexDef && (line.find("property float r")==0 || line.find("property float g")==0 || line.find("property float b")==0 || line.find("property float a")==0)) {
                colorCompsFound++;
                colors.resize(vertices.size());
                floatColor = true;
                continue;
            }
            else if (state==VertexDef && (line.find("property uchar red")==0 || line.find("property uchar green")==0 || line.find("property uchar blue")==0 || line.find("property uchar alpha")==0)) {
                colorCompsFound++;
                colors.resize(vertices.size());
                floatColor = false;
                continue;
            }

            if (state==VertexDef && (line.find("property float u")==0 || line.find("property float v")==0)) {
                texCoordsFound++;
                texcoord.resize(vertices.size());
                continue;
            }
            else if (state==VertexDef && (line.find("property float texture_u")==0 || line.find("property float texture_v")==0)) {
                texCoordsFound++;
                texcoord.resize(vertices.size());
                continue;
            }

            if (state==FaceDef && line.find("property list")!=0 && line!="end_header") {
                error = "wrong face definition";
                goto clean;
            }

            if (line=="end_header") {
                if (colors.size() && colorCompsFound!=3 && colorCompsFound!=4) {
                    error =  "data has color coordiantes but not correct number of components. Found " + toString(colorCompsFound) + " expecting 3 or 4";
                    goto clean;
                }
                if (normals.size() && normalsCoordsFound!=3) {
                    error = "data has normal coordiantes but not correct number of components. Found " + toString(normalsCoordsFound) + " expecting 3";
                    goto clean;
                }
                if (!vertices.size()) {
                    std::cout << "ERROR glMesh, load(): mesh loaded from \"" << _filename << "\" has no vertices" << std::endl;
                }
                if (orderVertices==-1) orderVertices=9999;
                if (orderIndices==-1) orderIndices=9999;

                if (orderVertices < orderIndices) {
                    state = Vertices;
                }
                else {
                    state = Faces;
                }
                continue;
            }

            if (state==Vertices) {
                std::stringstream sline;
                sline.str(line);
                glm::vec3 v;
                sline >> v.x;
                sline >> v.y;
                if ( vertexCoordsFound > 2) sline >> v.z;
                vertices[currentVertex] = v;

                if (normalsCoordsFound > 0) {
                    glm::vec3 n;
                    sline >> n.x;
                    sline >> n.y;
                    sline >> n.z;
                    normals[currentVertex] = n;
                }

                if (colorCompsFound > 0) {
                    if (floatColor) {
                        glm::vec4 c;
                        sline >> c.r;
                        sline >> c.g;
                        sline >> c.b;
                        if (colorCompsFound > 3) sline >> c.a;
                        colors[currentVertex] = c;
                    }
                    else {
                        float r, g, b, a = 255;
                        sline >> r;
                        sline >> g;
                        sline >> b;
                        if (colorCompsFound > 3) sline >> a;
                        colors[currentVertex] = glm::vec4(r/255.0, g/255.0, b/255.0, a/255.0);
                    }
                }

                if (texCoordsFound>0) {
                    glm::vec2 uv;
                    sline >> uv.x;
                    sline >> uv.y;
                    texcoord[currentVertex] = uv;
                }

                currentVertex++;
                if ((uint32_t)currentVertex==vertices.size()) {
                    if (orderVertices<orderIndices) {
                        state = Faces;
                    }
                    else{
                        state = Vertices;
                    }
                }
                continue;
            }

            if (state==Faces && indices.size() > 0) {
                std::stringstream sline;
                sline.str(line);
                int numV;
                sline >> numV;
                if (numV!=3) {
                    error = "face not a triangle";
                    goto clean;
                }
                int i;
                sline >> i;
                indices[currentFace*3] = i;
                sline >> i;
                indices[currentFace*3+1] = i;
                sline >> i;
                indices[currentFace*3+2] = i;

                currentFace++;
                if ((uint32_t)currentFace==indices.size()/3) {
                    if (orderVertices<orderIndices) {
                        state = Vertices;
                    }
                    else {
                        state = Faces;
                    }
                }
                continue;
            }
        }
        is.close();

        //  Succed loading the PLY data
        //  (proceed replacing the data on mesh)
        //
        _mesh.addColors(colors);
        _mesh.addVertices(vertices);
        _mesh.addTexCoords(texcoord);

        if ( indices.size() > 0 )
            _mesh.addIndices( indices );
        else 
            _mesh.setDrawMode( POINTS );
        
        if ( normals.size() > 0 )
            _mesh.addNormals( normals );
        else
            _mesh.computeNormals();

        _mesh.computeTangents();
        return true;

    clean:
        std::cout << "ERROR glMesh, load(): " << lineNum << ":" << error << std::endl;
        std::cout << "ERROR glMesh, load(): \"" << line << "\"" << std::endl;

    }

    is.close();
    std::cout << "ERROR glMesh, can not load  " << _filename << std::endl;

    return false;
}